

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Mio_LibraryMatchesStop(Mio_Library_t *pLib)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *__ptr_01;
  long lVar1;
  long lVar2;
  
  if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
    __ptr = pLib->vTt2Match;
    __ptr_01 = __ptr->pArray;
    lVar2 = 8;
    for (lVar1 = 0; lVar1 < __ptr->nCap; lVar1 = lVar1 + 1) {
      __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar2);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        __ptr_01 = __ptr->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar2) = 0;
      }
      lVar2 = lVar2 + 0x10;
    }
    free(__ptr_01);
    free(__ptr);
    Vec_MemHashFree(pLib->vTtMem);
    Vec_MemFree(pLib->vTtMem);
    if (pLib->pCells != (Mio_Cell2_t *)0x0) {
      free(pLib->pCells);
      pLib->pCells = (Mio_Cell2_t *)0x0;
    }
  }
  return;
}

Assistant:

void Mio_LibraryMatchesStop( Mio_Library_t * pLib )
{
    if ( !pLib->vTtMem )
        return;
    Vec_WecFree( pLib->vTt2Match );
    Vec_MemHashFree( pLib->vTtMem );
    Vec_MemFree( pLib->vTtMem );
    ABC_FREE( pLib->pCells );
}